

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal-multiple-loops.c
# Opt level: O0

void signal2_cb(uv_signal_t *handle,int signum)

{
  int signum_local;
  uv_signal_t *handle_local;
  
  if (signum != 0xc) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-signal-multiple-loops.c"
            ,0x4c,"signum == SIGUSR2");
    abort();
  }
  increment_counter(&signal2_cb_counter);
  uv_signal_stop(handle);
  return;
}

Assistant:

static void signal2_cb(uv_signal_t* handle, int signum) {
  ASSERT(signum == SIGUSR2);
  increment_counter(&signal2_cb_counter);
  uv_signal_stop(handle);
}